

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdEval(uint *pTruth,int nVars,int nLutSize)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdMan_t *p;
  uint *puVar4;
  int iVar5;
  ulong uVar6;
  
  pNtk = Kit_DsdDecomposeInt(pTruth,nVars,0);
  iVar3 = Kit_DsdCountLuts(pNtk,nLutSize);
  p = Kit_DsdManAlloc(nVars,(uint)pNtk->nNodes + (uint)pNtk->nVars);
  puVar4 = Kit_DsdTruthCompute(p,pNtk);
  uVar6 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  if (nVars < 6) {
    uVar6 = 1;
  }
  do {
    iVar5 = (int)uVar6;
    if (iVar5 < 1) goto LAB_005cd354;
    lVar1 = uVar6 - 1;
    lVar2 = uVar6 - 1;
    uVar6 = uVar6 - 1;
  } while (pTruth[lVar1] == puVar4[lVar2]);
  if (0 < iVar5) {
    puts("Verification failed.");
  }
LAB_005cd354:
  Kit_DsdManFree(p);
  Kit_DsdNtkFree(pNtk);
  return iVar3;
}

Assistant:

int Kit_DsdEval( unsigned * pTruth, int nVars, int nLutSize )
{
    Kit_DsdMan_t * p;
    Kit_DsdNtk_t * pNtk;
    unsigned * pTruthC;
    int Result;

    // decompose the function
    pNtk = Kit_DsdDecompose( pTruth, nVars );
    Result = Kit_DsdCountLuts( pNtk, nLutSize );
//    printf( "\n" );
//    Kit_DsdPrint( stdout, pNtk );
//    printf( "Eval = %d.\n", Result );

    // recompute the truth table
    p = Kit_DsdManAlloc( nVars, Kit_DsdNtkObjNum(pNtk) );
    pTruthC = Kit_DsdTruthCompute( p, pNtk );
    if ( !Kit_TruthIsEqual( pTruth, pTruthC, nVars ) )
        printf( "Verification failed.\n" );
    Kit_DsdManFree( p );

    Kit_DsdNtkFree( pNtk );
    return Result;
}